

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_CheckFakeFloorTriggers(AActor *mo,double oldz,bool oldz_has_viewheight)

{
  sector_t *psVar1;
  sector_t *psVar2;
  bool bVar3;
  ASectorAction *pAVar4;
  double dVar5;
  double dVar6;
  double local_48;
  double viewheight;
  double newz;
  double waterz;
  sector_t *hs;
  sector_t *sec;
  double dStack_18;
  bool oldz_has_viewheight_local;
  double oldz_local;
  AActor *mo_local;
  
  if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000U) == 0)) {
    psVar1 = mo->Sector;
    if (psVar1 == (sector_t *)0x0) {
      __assert_fail("sec != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xb90,"void P_CheckFakeFloorTriggers(AActor *, double, bool)");
    }
    if (((psVar1 != (sector_t *)0x0) && (psVar1->heightsec != (sector_t *)0x0)) &&
       (bVar3 = TObjPtr<ASectorAction>::operator!=(&psVar1->SecActTarget,(ASectorAction *)0x0),
       bVar3)) {
      psVar2 = psVar1->heightsec;
      dVar5 = secplane_t::ZatPoint(&psVar2->floorplane,mo);
      if (mo->player == (player_t *)0x0) {
        local_48 = mo->Height;
      }
      else {
        local_48 = mo->player->viewheight;
      }
      if ((dVar5 < oldz) && (dVar6 = AActor::Z(mo), dVar6 <= dVar5)) {
        pAVar4 = TObjPtr<ASectorAction>::operator->(&psVar1->SecActTarget);
        ASectorAction::TriggerAction(pAVar4,mo,0x400);
      }
      dVar6 = AActor::Z(mo);
      dVar6 = dVar6 + local_48;
      dStack_18 = oldz;
      if (!oldz_has_viewheight) {
        dStack_18 = local_48 + oldz;
      }
      if ((dVar5 < dStack_18) || (dVar6 <= dVar5)) {
        if ((dVar5 < dStack_18) && (dVar6 <= dVar5)) {
          pAVar4 = TObjPtr<ASectorAction>::operator->(&psVar1->SecActTarget);
          ASectorAction::TriggerAction(pAVar4,mo,0x40);
        }
      }
      else {
        pAVar4 = TObjPtr<ASectorAction>::operator->(&psVar1->SecActTarget);
        ASectorAction::TriggerAction(pAVar4,mo,0x80);
      }
      if ((psVar2->MoreFlags & 2) == 0) {
        dVar5 = secplane_t::ZatPoint(&psVar2->ceilingplane,mo);
        if ((dVar5 < dStack_18) || (dVar6 <= dVar5)) {
          if ((dVar5 < dStack_18) && (dVar6 <= dVar5)) {
            pAVar4 = TObjPtr<ASectorAction>::operator->(&psVar1->SecActTarget);
            ASectorAction::TriggerAction(pAVar4,mo,0x100);
          }
        }
        else {
          pAVar4 = TObjPtr<ASectorAction>::operator->(&psVar1->SecActTarget);
          ASectorAction::TriggerAction(pAVar4,mo,0x200);
        }
      }
    }
  }
  return;
}

Assistant:

void P_CheckFakeFloorTriggers (AActor *mo, double oldz, bool oldz_has_viewheight)
{
	if (mo->player && (mo->player->cheats & CF_PREDICTING))
	{
		return;
	}
	sector_t *sec = mo->Sector;
	assert (sec != NULL);
	if (sec == NULL)
	{
		return;
	}
	if (sec->heightsec != NULL && sec->SecActTarget != NULL)
	{
		sector_t *hs = sec->heightsec;
		double waterz = hs->floorplane.ZatPoint(mo);
		double newz;
		double viewheight;

		if (mo->player != NULL)
		{
			viewheight = mo->player->viewheight;
		}
		else
		{
			viewheight = mo->Height;
		}

		if (oldz > waterz && mo->Z() <= waterz)
		{ // Feet hit fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_HitFakeFloor);
		}

		newz = mo->Z() + viewheight;
		if (!oldz_has_viewheight)
		{
			oldz += viewheight;
		}

		if (oldz <= waterz && newz > waterz)
		{ // View went above fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesSurface);
		}
		else if (oldz > waterz && newz <= waterz)
		{ // View went below fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			waterz = hs->ceilingplane.ZatPoint(mo);
			if (oldz <= waterz && newz > waterz)
			{ // View went above fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesAboveC);
			}
			else if (oldz > waterz && newz <= waterz)
			{ // View went below fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesBelowC);
			}
		}
	}
}